

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::LinearSystem::dynamics
          (LinearSystem *this,VectorDynSize *state,double time,VectorDynSize *stateDynamics)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  size_t sVar5;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ostream *poVar9;
  bool isValid;
  ostringstream errorMsg;
  char local_239;
  PointerType local_238;
  long lStack_230;
  long local_228 [3];
  double local_210;
  PointerType local_208;
  long lStack_200;
  long local_1f8;
  undefined8 local_1e8;
  undefined8 local_1e0;
  PointerType local_1d0;
  long lStack_1c8;
  long local_1c0;
  undefined8 local_1b0;
  undefined8 local_1a8;
  ios_base local_198 [272];
  undefined8 local_88;
  undefined8 local_80;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  local_239 = '\0';
  peVar1 = (this->m_pimpl->stateMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_210 = time;
  iVar2 = (*peVar1->_vptr_TimeVaryingObject[2])(peVar1,&local_239);
  if (local_239 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Unable to retrieve a valid state matrix at time: ",0x31);
    poVar9 = std::ostream::_M_insert<double>(local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("LinearSystem","dynamics",(char *)local_238);
  }
  else {
    sVar4 = iDynTree::MatrixDynSize::rows();
    sVar5 = DynamicalSystem::stateSpaceSize(&this->super_DynamicalSystem);
    if (sVar4 == sVar5) {
      sVar4 = iDynTree::MatrixDynSize::cols();
      sVar5 = DynamicalSystem::stateSpaceSize(&this->super_DynamicalSystem);
      if (sVar4 == sVar5) {
        local_239 = '\0';
        peVar1 = (this->m_pimpl->controlMatrix).
                 super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar3 = (*peVar1->_vptr_TimeVaryingObject[2])(SUB84(local_210,0),peVar1,&local_239);
        if (local_239 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Unable to retrieve a valid control matrix at time: ",
                     0x33);
          poVar9 = std::ostream::_M_insert<double>(local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("LinearSystem","dynamics",(char *)local_238);
        }
        else {
          sVar4 = iDynTree::MatrixDynSize::rows();
          sVar5 = DynamicalSystem::stateSpaceSize(&this->super_DynamicalSystem);
          if (sVar4 == sVar5) {
            sVar4 = iDynTree::MatrixDynSize::cols();
            sVar5 = DynamicalSystem::controlSpaceSize(&this->super_DynamicalSystem);
            if (sVar4 == sVar5) {
              toEigen(&local_50,(MatrixDynSize *)CONCAT44(extraout_var,iVar2));
              uVar6 = iDynTree::VectorDynSize::data();
              uVar7 = iDynTree::VectorDynSize::size();
              local_238 = local_50.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              lStack_230 = local_50.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value;
              local_228[0] = local_50.
                             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             .m_cols.m_value;
              toEigen(&local_70,(MatrixDynSize *)CONCAT44(extraout_var_00,iVar3));
              (*(this->super_DynamicalSystem)._vptr_DynamicalSystem[4])(this);
              uVar8 = iDynTree::VectorDynSize::data();
              local_1a8 = iDynTree::VectorDynSize::size();
              local_208 = local_238;
              lStack_200 = lStack_230;
              local_1f8 = local_228[0];
              local_1d0 = local_70.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              lStack_1c8 = local_70.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value;
              local_1c0 = local_70.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value;
              local_1e8 = uVar6;
              local_1e0 = uVar7;
              local_1b0 = uVar8;
              uVar6 = iDynTree::VectorDynSize::data();
              local_80 = iDynTree::VectorDynSize::size();
              local_88 = uVar6;
              Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                        ((Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>> *)&local_88,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                          *)&local_208);
              return true;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"The control matrix at time: ",0x1c);
          poVar9 = std::ostream::_M_insert<double>(local_210);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     " has dimensions not matching with the specified state/control space dimension."
                     ,0x4e);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("LinearSystem","dynamics",(char *)local_238);
        }
        goto LAB_0013fb97;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"The state matrix at time: ",0x1a);
    poVar9 = std::ostream::_M_insert<double>(local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," has dimensions not matching with the specified state space dimension.",0x46)
    ;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("LinearSystem","dynamics",(char *)local_238);
  }
LAB_0013fb97:
  if (local_238 != (PointerType)local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_208);
  std::ios_base::~ios_base(local_198);
  return false;
}

Assistant:

bool LinearSystem::dynamics(const VectorDynSize& state,
                                    double time,
                                    VectorDynSize& stateDynamics)
        {
            bool isValid = false;
            const MatrixDynSize& stateMatrix = m_pimpl->stateMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid state matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            if ((stateMatrix.rows() != stateSpaceSize()) || (stateMatrix.cols() != stateSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The state matrix at time: " << time << " has dimensions not matching with the specified state space dimension.";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            isValid = false;
            const MatrixDynSize& controlMatrix = m_pimpl->controlMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid control matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            if ((controlMatrix.rows() != stateSpaceSize()) || (controlMatrix.cols() != controlSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The control matrix at time: " << time << " has dimensions not matching with the specified state/control space dimension.";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            iDynTree::toEigen(stateDynamics) = iDynTree::toEigen(stateMatrix) * iDynTree::toEigen(state) + iDynTree::toEigen(controlMatrix) * iDynTree::toEigen(controlInput());
            return true;
        }